

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

int __thiscall CSocekt::flyd_epoll_process_events(CSocekt *this,int timer)

{
  long lVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  code *pcVar5;
  long *plVar6;
  ulong uVar7;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  undefined1 local_1038 [12];
  undefined1 local_1028 [12];
  undefined1 local_1018 [12];
  Logger local_1008;
  
  uVar2 = epoll_wait(this->m_epollhandle,(epoll_event *)this->m_events,0x200,timer);
  if (uVar2 == 0xffffffff) {
    piVar3 = __errno_location();
    if (*piVar3 == 4) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1018,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file_00._12_4_ = 0;
      file_00.data_ = (char *)local_1018._0_8_;
      file_00.size_ = local_1018._8_4_;
      muduo::Logger::Logger(&local_1008,file_00,0x210,ERROR);
      muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_188d5);
      muduo::Logger::~Logger(&local_1008);
      return 1;
    }
    muduo::Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1028,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
              );
    file_01._12_4_ = 0;
    file_01.data_ = (char *)local_1028._0_8_;
    file_01.size_ = local_1028._8_4_;
    muduo::Logger::Logger(&local_1008,file_01,0x216,ERROR);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_188d5);
  }
  else {
    if (uVar2 != 0) {
      uVar7 = 0;
      uVar4 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar4 = uVar7;
      }
      for (; uVar4 * 0xc - uVar7 != 0; uVar7 = uVar7 + 0xc) {
        lVar1 = *(long *)((long)&this->m_events[0].data + uVar7);
        uVar2 = *(uint *)((long)&this->m_events[0].events + uVar7);
        if ((uVar2 & 1) != 0) {
          pcVar5 = *(code **)(lVar1 + 0x40);
          plVar6 = (long *)((long)&this->_vptr_CSocekt + *(long *)(lVar1 + 0x48));
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
          }
          (*pcVar5)(plVar6,lVar1);
        }
        if ((uVar2 & 4) != 0) {
          if ((uVar2 & 0x2018) == 0) {
            pcVar5 = *(code **)(lVar1 + 0x50);
            plVar6 = (long *)((long)&this->_vptr_CSocekt + *(long *)(lVar1 + 0x58));
            if (((ulong)pcVar5 & 1) != 0) {
              pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
            }
            (*pcVar5)(plVar6,lVar1);
          }
          else {
            LOCK();
            *(int *)(lVar1 + 0xe0) = *(int *)(lVar1 + 0xe0) + -1;
            UNLOCK();
          }
        }
      }
      return 1;
    }
    if (timer != -1) {
      return 1;
    }
    muduo::Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1038,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1038._0_8_;
    file.size_ = local_1038._8_4_;
    muduo::Logger::Logger(&local_1008,file,0x223,ERROR);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_188ec);
  }
  muduo::Logger::~Logger(&local_1008);
  return 0;
}

Assistant:

int CSocekt::flyd_epoll_process_events(int timer)
{
    //等待事件，事件会返回到m_events里，最多返回NGX_MAX_EVENTS个事件【因为我只提供了这些内存】；
    //如果两次调用epoll_wait()的事件间隔比较长，则可能在epoll的双向链表中，积累了多个事件，所以调用epoll_wait，可能取到多个事件
    //阻塞timer这么长时间除非：a)阻塞时间到达 b)阻塞期间收到事件【比如新用户连入】会立刻返回c)调用时有事件也会立刻返回d)如果来个信号，比如你用kill -1 pid测试
    //如果timer为-1则一直阻塞，如果timer为0则立即返回，即便没有任何事件
    //返回值：有错误发生返回-1，错误在errno中，比如你发个信号过来，就返回-1，错误信息是(4: Interrupted system call)
    //       如果你等待的是一段时间，并且超时了，则返回0；
    //       如果返回>0则表示成功捕获到这么多个事件【返回值里】
    int events = epoll_wait(m_epollhandle,m_events,FLYD_MAX_EVENTS,timer);
    
    if(events == -1)
    {
        //有错误发生，发送某个信号给本进程就可以导致这个条件成立，而且错误码根据观察是4；
        //#define EINTR  4，EINTR错误的产生：当阻塞于某个慢系统调用的一个进程捕获某个信号且相应信号处理函数返回时，该系统调用可能返回一个EINTR错误。
               //例如：在socket服务器端，设置了信号捕获机制，有子进程，当在父进程阻塞于慢系统调用时由父进程捕获到了一个有效信号时，内核会致使accept返回一个EINTR错误(被中断的系统调用)。
        if(errno == EINTR) 
        {
            //信号所致，直接返回，一般认为这不是毛病，但还是打印下日志记录一下，因为一般也不会人为给worker进程发送消息
            LOG_ERROR << "CSocekt::ngx_epoll_process_events()中epoll_wait()失败!";
            return 1;  //正常返回
        }
        else
        {
            //这被认为应该是有问题，记录日志
            LOG_ERROR << "CSocekt::ngx_epoll_process_events()中epoll_wait()失败!";
            return 0;  //非正常返回 
        }
    }

    if(events == 0) //超时，但没事件来
    {
        if(timer != -1)
        {
            //要求epoll_wait阻塞一定的时间而不是一直阻塞，这属于阻塞到时间了，则正常返回
            return 1;
        }
        //无限等待【所以不存在超时】，但却没返回任何事件，这应该不正常有问题     
        LOG_ERROR <<"CSocekt::ngx_epoll_process_events()中epoll_wait()没超时却没返回任何事件!";
        return 0; //非正常返回 
    }

    //会惊群，一个telnet上来，4个worker进程都会被惊动，都执行下边这个
    //ngx_log_stderr(errno,"惊群测试1:%d",events); 

    //走到这里，就是属于有事件收到了
    lp_connection_t p_Conn;
    //uintptr_t          instance;
    uint32_t           revents;
    for(int i = 0; i < events; ++i)    //遍历本次epoll_wait返回的所有事件，注意events才是返回的实际事件数量
    {
        p_Conn = (lp_connection_t)(m_events[i].data.ptr);           //ngx_epoll_add_event()给进去的，这里能取出来

        /*
        instance = (uintptr_t) c & 1;                             //将地址的最后一位取出来，用instance变量标识, 见ngx_epoll_add_event，该值是当时随着连接池中的连接一起给进来的
                                                                  //取得的是你当时调用ngx_epoll_add_event()的时候，这个连接里边的instance变量的值；
        p_Conn = (lpngx_connection_t) ((uintptr_t)p_Conn & (uintptr_t) ~1); //最后1位干掉，得到真正的c地址

        //仔细分析一下官方nginx的这个判断
        //过滤过期事件的；
        if(c->fd == -1)  //一个套接字，当关联一个 连接池中的连接【对象】时，这个套接字值是要给到c->fd的，
                           //那什么时候这个c->fd会变成-1呢？关闭连接时这个fd会被设置为-1，哪行代码设置的-1再研究，但应该不是ngx_free_connection()函数设置的-1
        {                 
            //比如我们用epoll_wait取得三个事件，处理第一个事件时，因为业务需要，我们把这个连接关闭，那我们应该会把c->fd设置为-1；
            //第二个事件照常处理
            //第三个事件，假如这第三个事件，也跟第一个事件对应的是同一个连接，那这个条件就会成立；那么这种事件，属于过期事件，不该处理

            //这里可以增加个日志，也可以不增加日志
            ngx_log_error_core(NGX_LOG_DEBUG,0,"CSocekt::ngx_epoll_process_events()中遇到了fd=-1的过期事件:%p.",c); 
            continue; //这种事件就不处理即可
        }

        //过滤过期事件的；
        if(c->instance != instance)
        {
            //--------------------以下这些说法来自于资料--------------------------------------
            //什么时候这个条件成立呢？【换种问法：instance标志为什么可以判断事件是否过期呢？】
            //比如我们用epoll_wait取得三个事件，处理第一个事件时，因为业务需要，我们把这个连接关闭【麻烦就麻烦在这个连接被服务器关闭上了】，但是恰好第三个事件也跟这个连接有关；
            //因为第一个事件就把socket连接关闭了，显然第三个事件我们是不应该处理的【因为这是个过期事件】，若处理肯定会导致错误；
            //那我们上述把c->fd设置为-1，可以解决这个问题吗？ 能解决一部分问题，但另外一部分不能解决，不能解决的问题描述如下【这么离奇的情况应该极少遇到】：

            //a)处理第一个事件时，因为业务需要，我们把这个连接【假设套接字为50】关闭，同时设置c->fd = -1;并且调用ngx_free_connection将该连接归还给连接池；
            //b)处理第二个事件，恰好第二个事件是建立新连接事件，调用ngx_get_connection从连接池中取出的连接非常可能就是刚刚释放的第一个事件对应的连接池中的连接；
            //c)又因为a中套接字50被释放了，所以会被操作系统拿来复用，复用给了b)【一般这么快就被复用也是醉了】；
            //d)当处理第三个事件时，第三个事件其实是已经过期的，应该不处理，那怎么判断这第三个事件是过期的呢？ 【假设现在处理的是第三个事件，此时这个 连接池中的该连接 实际上已经被用作第二个事件对应的socket上了】；
                //依靠instance标志位能够解决这个问题，当调用ngx_get_connection从连接池中获取一个新连接时，我们把instance标志位置反，所以这个条件如果不成立，说明这个连接已经被挪作他用了；

            //--------------------我的个人思考--------------------------------------
            //如果收到了若干个事件，其中连接关闭也搞了多次，导致这个instance标志位被取反2次，那么，造成的结果就是：还是有可能遇到某些过期事件没有被发现【这里也就没有被continue】，照旧被当做没过期事件处理了；
                  //如果是这样，那就只能被照旧处理了。可能会造成偶尔某个连接被误关闭？但是整体服务器程序运行应该是平稳，问题不大的，这种漏网而被当成没过期来处理的的过期事件应该是极少发生的

            ngx_log_error_core(NGX_LOG_DEBUG,0,"CSocekt::ngx_epoll_process_events()中遇到了instance值改变的过期事件:%p.",c); 
            continue; //这种事件就不处理即可
        }
        //存在一种可能性，过期事件没被过滤完整【非常极端】，走下来的；
        */

        //能走到这里，我们认为这些事件都没过期，就正常开始处理
        revents = m_events[i].events;//取出事件类型
        
        /*
        if(revents & (EPOLLERR|EPOLLHUP)) //例如对方close掉套接字，这里会感应到【换句话说：如果发生了错误或者客户端断连】
        {
            //这加上读写标记，方便后续代码处理，至于怎么处理，后续再说，这里也是参照nginx官方代码引入的这段代码；
            //官方说法：if the error events were returned, add EPOLLIN and EPOLLOUT，to handle the events at least in one active handler
            //我认为官方也是经过反复思考才加上着东西的，先放这里放着吧； 
            revents |= EPOLLIN|EPOLLOUT;   //EPOLLIN：表示对应的链接上有数据可以读出（TCP链接的远端主动关闭连接，也相当于可读事件，因为本服务器小处理发送来的FIN包）
                                           //EPOLLOUT：表示对应的连接上可以写入数据发送【写准备好】            
        } */

        if(revents & EPOLLIN)  //如果是读事件
        {
            //ngx_log_stderr(errno,"数据来了来了来了 ~~~~~~~~~~~~~.");
            //一个客户端新连入，这个会成立，
            //已连接发送数据来，这个也成立；
            //c->r_ready = 1;                         //标记可以读；【从连接池拿出一个连接时这个连接的所有成员都是0】            
            (this->* (p_Conn->rhandler) )(p_Conn);    //注意括号的运用来正确设置优先级，防止编译出错；【如果是个新客户连入
                                                      //如果新连接进入，这里执行的应该是CSocekt::ngx_event_accept(c)】            
                                                      //如果是已经连入，发送数据到这里，则这里执行的应该是 CSocekt::ngx_read_request_handler()                                                      
        }
        
        if(revents & EPOLLOUT) //如果是写事件【对方关闭连接也触发这个，再研究。。。。。。】，注意上边的 if(revents & (EPOLLERR|EPOLLHUP))  revents |= EPOLLIN|EPOLLOUT; 读写标记都给加上了
        {
            //ngx_log_stderr(errno,"22222222222222222222.");
            if(revents & (EPOLLERR | EPOLLHUP | EPOLLRDHUP)) //客户端关闭，如果服务器端挂着一个写通知事件，则这里个条件是可能成立的
            {
                //EPOLLERR：对应的连接发生错误                     8     = 1000 
                //EPOLLHUP：对应的连接被挂起                       16    = 0001 0000
                //EPOLLRDHUP：表示TCP连接的远端关闭或者半关闭连接   8192   = 0010  0000   0000   0000
                //我想打印一下日志看一下是否会出现这种情况
                //8221 = ‭0010 0000 0001 1101‬  ：包括 EPOLLRDHUP ，EPOLLHUP， EPOLLERR
                //ngx_log_stderr(errno,"CSocekt::ngx_epoll_process_events()中revents&EPOLLOUT成立并且revents & (EPOLLERR|EPOLLHUP|EPOLLRDHUP)成立,event=%ud。",revents); 

                //我们只有投递了 写事件，但对端断开时，程序流程才走到这里，投递了写事件意味着 iThrowsendCount标记肯定被+1了，这里我们减回阿里
                p_Conn->iThrowsendCount.decrement();                 
            }
            else
            {
                (this->* (p_Conn->whandler) )(p_Conn);   //如果有数据没有发送完毕，由系统驱动来发送，则这里执行的应该是 CSocekt::ngx_write_request_handler()
            }
            
        }
    } //end for(int i = 0; i < events; ++i)
    return 1;
}